

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::UniformCase::UniformCase
          (UniformCase *this,Context *context,char *name,char *description,deUint32 seed)

{
  int iVar1;
  deUint32 dVar2;
  CaseShaderType CVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *log;
  UniformCollection *ptr;
  deUint32 seed_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  UniformCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_015a31e0;
  pRVar4 = Context::getRenderContext(context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_015a31e0;
  dVar2 = randomFeatures(seed);
  *(deUint32 *)&(this->super_CallLogWrapper).field_0x14 = dVar2;
  ptr = (UniformCollection *)
        anon_unknown_1::UniformCollection::random((UniformCollection *)(ulong)seed);
  de::SharedPtr<const_deqp::gles3::Functional::(anonymous_namespace)::UniformCollection>::SharedPtr
            (&this->m_uniformCollection,ptr);
  CVar3 = randomCaseShaderType(seed);
  this->m_caseShaderType = CVar3;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::vector(&this->m_textures2d);
  std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::vector
            (&this->m_texturesCube);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_filledTextureUnits);
  return;
}

Assistant:

UniformCase::UniformCase (Context& context, const char* name, const char* description, const deUint32 seed)
	: TestCase				(context, name, description)
	, CallLogWrapper		(context.getRenderContext().getFunctions(), m_testCtx.getLog())
	, m_features			(randomFeatures(seed))
	, m_uniformCollection	(UniformCollection::random(seed))
	, m_caseShaderType		(randomCaseShaderType(seed))
{
}